

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

void __thiscall
helics::Input::registerNotificationCallback
          (Input *this,function<void_(TimeRepresentation<count_time<9,_long>_>)> *callback)

{
  function<void_(TimeRepresentation<count_time<9,_long>_>)> *in_RDI;
  anon_class_40_2_28a14680 *in_stack_ffffffffffffff98;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffffa0;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffffd0;
  Input *in_stack_ffffffffffffffd8;
  ValueFederate *in_stack_ffffffffffffffe0;
  
  std::function<void_(TimeRepresentation<count_time<9,_long>_>)>::function
            ((function<void_(TimeRepresentation<count_time<9,_long>_>)> *)in_RDI[1]._M_invoker,
             in_RDI);
  std::function<void(helics::Input&,TimeRepresentation<count_time<9,long>>)>::
  function<helics::Input::registerNotificationCallback(std::function<void(TimeRepresentation<count_time<9,long>>)>)::__0,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  helics::ValueFederate::setInputNotificationCallback
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::~function
            ((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *)0x43265f)
  ;
  registerNotificationCallback(std::function<void(TimeRepresentation<count_time<9,long>>)>)::$_0::
  ~__0((anon_class_40_2_28a14680 *)0x432669);
  return;
}

Assistant:

void Input::registerNotificationCallback(std::function<void(Time)> callback)
{
    fed->setInputNotificationCallback(*this,
                                      [this, callback = std::move(callback)](const Input& /*inp*/,
                                                                             Time time) {
                                          if (isUpdated()) {
                                              callback(time);
                                          }
                                      });
}